

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O3

void __thiscall testinator::TestRegistry::Unregister(TestRegistry *this,Test *test)

{
  TestNameMap *this_00;
  TestSuiteNameMap *this_01;
  Test *pTVar1;
  mapped_type *pmVar2;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar4;
  Test *local_28;
  
  this_00 = &this->m_testNames;
  local_28 = test;
  pmVar2 = std::
           map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_28);
  pVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
                         *)this,pmVar2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
                  *)this,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
  pVar4 = std::
          _Rb_tree<testinator::Test_*,_std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&this_00->_M_t,&local_28);
  std::
  _Rb_tree<testinator::Test_*,_std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  this_01 = &this->m_suiteNames;
  pmVar2 = std::
           map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_01,&local_28);
  pVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          ::equal_range(&(this->m_testsBySuite)._M_t,pmVar2);
  pTVar1 = local_28;
  __position._M_node = (_Base_ptr)pVar3.first._M_node;
  do {
    if (__position._M_node == pVar3.second._M_node._M_node) {
LAB_00107545:
      pVar4 = std::
              _Rb_tree<testinator::Test_*,_std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::equal_range(&this_01->_M_t,&local_28);
      std::
      _Rb_tree<testinator::Test_*,_std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
      return;
    }
    if (*(Test **)(__position._M_node + 2) == pTVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
                          *)&this->m_testsBySuite,__position);
      goto LAB_00107545;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void Unregister(Test* test)
    {
      const std::string& testName = m_testNames[test];
      m_tests.erase(testName);
      m_testNames.erase(test);

      const std::string& suiteName = m_suiteNames[test];
      auto range = m_testsBySuite.equal_range(suiteName);
      for (auto& i = range.first; i != range.second; ++i)
      {
        if (i->second == test)
        {
          m_testsBySuite.erase(i);
          break;
        }
      }
      m_suiteNames.erase(test);
    }